

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  int iVar1;
  float *pfVar2;
  stbi__context *in_RCX;
  stbi__context *in_RDX;
  undefined4 *in_RSI;
  stbi__uint32 in_R8D;
  stbi__context *in_R9;
  float *hdr;
  int *in_stack_00000060;
  stbi__context *in_stack_00000068;
  int in_stack_00000080;
  stbi__result_info *in_stack_000003f0;
  int in_stack_000003fc;
  int *in_stack_00000400;
  int *in_stack_00000408;
  int *in_stack_00000410;
  stbi__context *in_stack_00000418;
  stbi__result_info *in_stack_00000460;
  int in_stack_0000046c;
  int *in_stack_00000470;
  int *in_stack_00000478;
  int *in_stack_00000480;
  stbi__context *in_stack_00000488;
  stbi__result_info *in_stack_00008808;
  int in_stack_00008814;
  int *in_stack_00008818;
  int *in_stack_00008820;
  int *in_stack_00008828;
  stbi__context *in_stack_00008830;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  stbi__context *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  stbi__result_info *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  stbi_uc *local_8;
  
  memset(in_R9,0,0xc);
  in_R9->img_x = 8;
  in_R9->img_n = 0;
  in_R9->img_y = 0;
  iVar1 = stbi__jpeg_test(in_stack_ffffffffffffffa0);
  if (iVar1 == 0) {
    iVar1 = stbi__png_test(in_stack_ffffffffffffffa0);
    if (iVar1 == 0) {
      iVar1 = stbi__bmp_test(in_stack_ffffffffffffffa0);
      if (iVar1 == 0) {
        iVar1 = stbi__gif_test(in_stack_ffffffffffffffa0);
        if (iVar1 == 0) {
          iVar1 = stbi__psd_test(in_stack_ffffffffffffffa0);
          if (iVar1 == 0) {
            iVar1 = stbi__pic_test(in_stack_ffffffffffffffa0);
            if (iVar1 == 0) {
              iVar1 = stbi__pnm_test((stbi__context *)
                                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
              if (iVar1 == 0) {
                iVar1 = stbi__hdr_test(in_stack_ffffffffffffffa0);
                if (iVar1 == 0) {
                  iVar1 = stbi__tga_test(in_stack_ffffffffffffffa0);
                  if (iVar1 == 0) {
                    stbi__err("unknown image type");
                    local_8 = (stbi_uc *)0x0;
                  }
                  else {
                    local_8 = (stbi_uc *)
                              stbi__tga_load(in_stack_00000068,in_stack_00000060,(int *)s,x,y._4_4_,
                                             (stbi__result_info *)comp);
                  }
                }
                else {
                  pfVar2 = stbi__hdr_load(in_stack_00000418,in_stack_00000410,in_stack_00000408,
                                          in_stack_00000400,in_stack_000003fc,in_stack_000003f0);
                  if (in_R8D == 0) {
                    in_R8D = in_RCX->img_x;
                  }
                  local_8 = stbi__hdr_to_ldr((float *)CONCAT44(in_RDX->img_x,*in_RSI),
                                             (int)((ulong)pfVar2 >> 0x20),(int)pfVar2,in_R8D);
                }
              }
              else {
                local_8 = (stbi_uc *)
                          stbi__pnm_load(in_R9,in_stack_ffffffffffffffc0,
                                         (int *)CONCAT44(in_stack_ffffffffffffffbc,
                                                         in_stack_ffffffffffffffb8),
                                         &in_stack_ffffffffffffffb0->bits_per_channel,
                                         in_stack_ffffffffffffffac,
                                         (stbi__result_info *)in_stack_ffffffffffffffa0);
              }
            }
            else {
              local_8 = (stbi_uc *)
                        stbi__pic_load(in_RCX,(int *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                                       (int *)in_R9,in_stack_ffffffffffffffc0,
                                       in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0);
            }
          }
          else {
            local_8 = (stbi_uc *)
                      stbi__psd_load(in_stack_00000068,in_stack_00000060,(int *)s,x,y._4_4_,
                                     (stbi__result_info *)comp,in_stack_00000080);
          }
        }
        else {
          local_8 = (stbi_uc *)
                    stbi__gif_load(in_stack_00008830,in_stack_00008828,in_stack_00008820,
                                   in_stack_00008818,in_stack_00008814,in_stack_00008808);
        }
      }
      else {
        local_8 = (stbi_uc *)
                  stbi__bmp_load(in_stack_00000488,in_stack_00000480,in_stack_00000478,
                                 in_stack_00000470,in_stack_0000046c,in_stack_00000460);
      }
    }
    else {
      local_8 = (stbi_uc *)
                stbi__png_load(in_RDX,(int *)in_RCX,
                               (int *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),(int *)in_R9,
                               (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                               (stbi__result_info *)
                               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
  }
  else {
    local_8 = (stbi_uc *)
              stbi__jpeg_load((stbi__context *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                              (int *)in_R9,in_stack_ffffffffffffffc0,
                              (int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                              (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                              (stbi__result_info *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  return local_8;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}